

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsTypes.cpp
# Opt level: O0

void helics::helicsGetComplexVector
               (string_view val,
               vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *data)

{
  string_view V;
  string_view V_00;
  string_view trimCharacters;
  string_view trimCharacters_00;
  string_view val_00;
  string_view val_01;
  string_view jsonString;
  string_view val_02;
  string_view val_03;
  bool bVar1;
  value_t vVar2;
  int iVar3;
  const_reference pvVar4;
  size_type sVar5;
  size_type sVar6;
  iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  *in_RDX;
  char *in_RSI;
  size_t in_RDI;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  *in_XMM1_Qa;
  iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  *piVar7;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *aval;
  iterator __end5;
  iterator __begin5;
  json *__range5;
  int cnt;
  json json;
  complex<double> cval_1;
  complex<double> cval;
  size_type nextChar_1;
  int ii_1;
  size_type firstBracket_1;
  int size_1;
  invalid_argument *anon_var_0;
  double val2;
  double val1;
  basic_string_view<char,_std::char_traits<char>_> vstr2;
  basic_string_view<char,_std::char_traits<char>_> vstr1;
  size_type secondChar;
  size_type nextChar;
  int ii;
  size_type firstBracket;
  int size;
  iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  *in_stack_fffffffffffffca8;
  char cVar8;
  iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  *in_stack_fffffffffffffcb0;
  iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  *in_stack_fffffffffffffcb8;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *in_stack_fffffffffffffcc0;
  char *in_stack_fffffffffffffcc8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffcd0;
  size_type in_stack_fffffffffffffcd8;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *in_stack_fffffffffffffce0;
  iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  *in_stack_fffffffffffffcf8;
  string_view *in_stack_fffffffffffffd00;
  size_t in_stack_fffffffffffffd08;
  char *in_stack_fffffffffffffd10;
  char *in_stack_fffffffffffffd18;
  size_t in_stack_fffffffffffffd20;
  char *in_stack_fffffffffffffd28;
  iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
  *in_stack_fffffffffffffd38;
  complex<double> local_220;
  undefined8 local_210;
  double local_208;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *local_200;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  *local_1b8;
  undefined8 local_1b0;
  double local_1a8;
  uint local_19c;
  size_t local_198;
  char *pcStack_190;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  local_180;
  size_t local_170;
  size_t in_stack_fffffffffffffe98;
  char *in_stack_fffffffffffffea0;
  int local_124;
  int local_3c;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  local_10._M_len = in_RDI;
  local_10._M_str = in_RSI;
  bVar1 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_10);
  if (bVar1) {
    std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::resize
              ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
               in_stack_fffffffffffffcd0,(size_type)in_stack_fffffffffffffcc8);
  }
  else {
    pvVar4 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::front(&local_10);
    if (*pvVar4 == 'v') {
      val_00._M_str = in_stack_fffffffffffffd18;
      val_00._M_len = (size_t)in_stack_fffffffffffffd10;
      iVar3 = readSize(val_00);
      cVar8 = (char)((ulong)in_stack_fffffffffffffca8 >> 0x38);
      std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::reserve
                (in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
      std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::resize
                ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                 in_stack_fffffffffffffcd0,(size_type)in_stack_fffffffffffffcc8);
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffcb0,cVar8
                 ,0x434213);
      for (local_3c = 0; local_3c < iVar3 + -1; local_3c = local_3c + 2) {
        std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                  (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,
                   (size_type)in_stack_fffffffffffffcc0);
        std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                  (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,
                   (size_type)in_stack_fffffffffffffcc0);
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::substr
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffcd0,
                   (size_type)in_stack_fffffffffffffcc8,(size_type)in_stack_fffffffffffffcc0);
        trimCharacters._M_str = in_stack_fffffffffffffd10;
        trimCharacters._M_len = in_stack_fffffffffffffd08;
        gmlc::utilities::string_viewOps::trimString(in_stack_fffffffffffffd00,trimCharacters);
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::substr
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffcd0,
                   (size_type)in_stack_fffffffffffffcc8,(size_type)in_stack_fffffffffffffcc0);
        trimCharacters_00._M_str = in_stack_fffffffffffffd10;
        trimCharacters_00._M_len = in_stack_fffffffffffffd08;
        gmlc::utilities::string_viewOps::trimString(in_stack_fffffffffffffd00,trimCharacters_00);
        V._M_str = (char *)in_stack_fffffffffffffcc0;
        V._M_len = (size_t)in_stack_fffffffffffffcb8;
        gmlc::utilities::numConv<double>(V);
        V_00._M_str = (char *)in_stack_fffffffffffffcc0;
        V_00._M_len = (size_t)in_stack_fffffffffffffcb8;
        gmlc::utilities::numConv<double>(V_00);
        std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
        emplace_back<double&,double&>
                  (in_stack_fffffffffffffcc0,(double *)in_stack_fffffffffffffcb8,
                   (double *)in_stack_fffffffffffffcb0);
      }
    }
    else {
      pvVar4 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::front(&local_10);
      if (*pvVar4 == 'c') {
        val_01._M_str = in_stack_fffffffffffffd18;
        val_01._M_len = (size_t)in_stack_fffffffffffffd10;
        iVar3 = readSize(val_01);
        cVar8 = (char)((ulong)in_stack_fffffffffffffca8 >> 0x38);
        std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::reserve
                  (in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8);
        std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::resize
                  ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                   in_stack_fffffffffffffcd0,(size_type)in_stack_fffffffffffffcc8);
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                  ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffcb0,
                   cVar8,0x4345da);
        for (local_124 = 0; local_124 < iVar3; local_124 = local_124 + 1) {
          std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                    (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,
                     (size_type)in_stack_fffffffffffffcc0);
          CLI::std::basic_string_view<char,_std::char_traits<char>_>::substr
                    ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffcd0,
                     (size_type)in_stack_fffffffffffffcc8,(size_type)in_stack_fffffffffffffcc0);
          val_02._M_str = in_stack_fffffffffffffea0;
          val_02._M_len = in_stack_fffffffffffffe98;
          helicsGetComplex(val_02);
          std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::push_back
                    (in_stack_fffffffffffffcc0,(value_type *)in_stack_fffffffffffffcb8);
        }
      }
      else {
        sVar5 = std::basic_string_view<char,_std::char_traits<char>_>::find_first_of
                          (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,
                           (size_type)in_stack_fffffffffffffcc0);
        if (sVar5 == 0xffffffffffffffff) {
          local_198 = local_10._M_len;
          pcStack_190 = local_10._M_str;
          jsonString._M_str = in_stack_fffffffffffffd28;
          jsonString._M_len = in_stack_fffffffffffffd20;
          fileops::loadJsonStr_abi_cxx11_(jsonString);
          local_19c = 0;
          vVar2 = nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  ::type(&local_180);
          if (vVar2 == array) {
            local_1b8 = &local_180;
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::begin((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                     *)in_stack_fffffffffffffcb8);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::end((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                   *)in_stack_fffffffffffffcb8);
            while (bVar1 = nlohmann::json_abi_v3_11_3::detail::
                           iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                           ::
                           operator!=<nlohmann::json_abi_v3_11_3::detail::iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>,_nullptr>
                                     (in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8), bVar1) {
              local_200 = nlohmann::json_abi_v3_11_3::detail::
                          iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                          ::operator*(in_stack_fffffffffffffd38);
              bVar1 = nlohmann::json_abi_v3_11_3::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      ::is_number((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                   *)in_stack_fffffffffffffcb0);
              if (bVar1) {
                bVar1 = local_19c != 0;
                if (bVar1) {
                  in_XMM1_Qa = (iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                *)nlohmann::json_abi_v3_11_3::
                                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                  ::get<double,double>
                                            ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                              *)in_stack_fffffffffffffcb0);
                  std::complex<double>::complex(&local_220,0.0,(double)in_XMM1_Qa);
                  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::back
                            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *
                             )in_stack_fffffffffffffcb0);
                  std::complex<double>::operator+=
                            ((complex<double> *)in_stack_fffffffffffffcb0,
                             (complex<double> *)in_stack_fffffffffffffca8);
                }
                else {
                  local_208 = nlohmann::json_abi_v3_11_3::
                              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              ::get<double,double>
                                        ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                          *)in_stack_fffffffffffffcb0);
                  local_210 = 0;
                  std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
                  emplace_back<double,double>
                            (in_stack_fffffffffffffcc0,(double *)in_stack_fffffffffffffcb8,
                             (double *)in_stack_fffffffffffffcb0);
                }
                local_19c = (uint)!bVar1;
              }
              else {
                bVar1 = nlohmann::json_abi_v3_11_3::
                        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        ::is_array(local_200);
                if (bVar1) {
                  local_19c = 0;
                  sVar6 = nlohmann::json_abi_v3_11_3::
                          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                          ::size((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                  *)in_stack_fffffffffffffcb8);
                  if (sVar6 < 2) {
                    sVar6 = nlohmann::json_abi_v3_11_3::
                            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                            ::size((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                    *)in_stack_fffffffffffffcb8);
                    if (sVar6 == 1) {
                      nlohmann::json_abi_v3_11_3::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                    *)in_stack_fffffffffffffd00,(size_type)in_stack_fffffffffffffcf8
                                  );
                      bVar1 = nlohmann::json_abi_v3_11_3::
                              basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                              ::is_number((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                           *)in_stack_fffffffffffffcb0);
                      if (bVar1) {
                        nlohmann::json_abi_v3_11_3::
                        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                      *)in_stack_fffffffffffffd00,
                                     (size_type)in_stack_fffffffffffffcf8);
                        in_stack_fffffffffffffcc0 =
                             (vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *
                             )nlohmann::json_abi_v3_11_3::
                              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              ::get<double,double>
                                        ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                          *)in_stack_fffffffffffffcb0);
                        std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
                        emplace_back<double,double>
                                  (in_stack_fffffffffffffcc0,(double *)in_stack_fffffffffffffcb8,
                                   (double *)in_stack_fffffffffffffcb0);
                      }
                    }
                    else {
                      in_stack_fffffffffffffca8 = in_RDX;
                      invalidValue<std::complex<double>>();
                      piVar7 = (iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
                                *)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
                      in_stack_fffffffffffffcb0 = in_XMM1_Qa;
                      in_stack_fffffffffffffcb8 = piVar7;
                      std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::
                      push_back((vector<std::complex<double>,_std::allocator<std::complex<double>_>_>
                                 *)in_XMM1_Qa,(value_type *)in_stack_fffffffffffffca8);
                      in_XMM1_Qa = piVar7;
                    }
                  }
                  else {
                    nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                  *)in_stack_fffffffffffffd00,(size_type)in_stack_fffffffffffffcf8);
                    bVar1 = nlohmann::json_abi_v3_11_3::
                            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                            ::is_number((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                         *)in_stack_fffffffffffffcb0);
                    if (bVar1) {
                      in_stack_fffffffffffffcf8 = in_RDX;
                      in_stack_fffffffffffffd00 =
                           (string_view *)
                           nlohmann::json_abi_v3_11_3::
                           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                           ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                         *)in_stack_fffffffffffffd00,(size_type)in_RDX);
                      nlohmann::json_abi_v3_11_3::
                      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                      ::get<double,double>
                                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                  *)in_stack_fffffffffffffcb0);
                      nlohmann::json_abi_v3_11_3::
                      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      ::operator[]((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                    *)in_stack_fffffffffffffd00,(size_type)in_stack_fffffffffffffcf8
                                  );
                      nlohmann::json_abi_v3_11_3::
                      basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                      ::get<double,double>
                                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                  *)in_stack_fffffffffffffcb0);
                      std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
                      emplace_back<double,double>
                                (in_stack_fffffffffffffcc0,(double *)in_stack_fffffffffffffcb8,
                                 (double *)in_stack_fffffffffffffcb0);
                    }
                  }
                }
              }
              nlohmann::json_abi_v3_11_3::detail::
              iter_impl<nlohmann::json_abi_v3_11_3::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_>
              ::operator++(in_stack_fffffffffffffcb0);
            }
          }
          else if ((byte)(vVar2 - number_integer) < 3) {
            std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::resize
                      ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                       in_stack_fffffffffffffcd0,(size_type)in_stack_fffffffffffffcc8);
            local_1a8 = nlohmann::json_abi_v3_11_3::
                        basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                        ::get<double,double>
                                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                    *)in_stack_fffffffffffffcb0);
            local_1b0 = 0;
            std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
            emplace_back<double,double>
                      (in_stack_fffffffffffffcc0,(double *)in_stack_fffffffffffffcb8,
                       (double *)in_stack_fffffffffffffcb0);
          }
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                         *)in_stack_fffffffffffffcb0);
        }
        else {
          local_170 = local_10._M_len;
          val_03._M_str = in_stack_fffffffffffffea0;
          val_03._M_len = (size_t)local_10._M_str;
          helicsGetComplex(val_03);
          std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::resize
                    ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                     in_stack_fffffffffffffcd0,(size_type)in_stack_fffffffffffffcc8);
          std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::push_back
                    (in_stack_fffffffffffffcc0,(value_type *)in_stack_fffffffffffffcb8);
        }
      }
    }
  }
  return;
}

Assistant:

void helicsGetComplexVector(std::string_view val, std::vector<std::complex<double>>& data)
{
    if (val.empty()) {
        data.resize(0);
        return;
    }
    if (val.front() == 'v') {
        auto size = readSize(val);
        data.reserve(size / 2);
        data.resize(0);
        auto firstBracket = val.find_first_of('[');
        for (decltype(size) ii = 0; ii < size - 1; ii += 2) {
            auto nextChar = val.find_first_of(",;]", firstBracket + 1);
            auto secondChar = val.find_first_of(",;]", nextChar + 1);
            try {
                auto vstr1 = val.substr(firstBracket + 1, nextChar - firstBracket - 1);
                string_viewOps::trimString(vstr1);
                auto vstr2 = val.substr(nextChar + 1, secondChar - nextChar - 1);
                string_viewOps::trimString(vstr2);
                auto val1 = numConv<double>(vstr1);
                auto val2 = numConv<double>(vstr2);
                data.emplace_back(val1, val2);
            }
            catch (const std::invalid_argument&) {
                data.push_back(invalidValue<std::complex<double>>());
            }
            firstBracket = nextChar;
        }
    } else if (val.front() == 'c') {
        auto size = readSize(val);
        data.reserve(size);
        data.resize(0);
        auto firstBracket = val.find_first_of('[');
        for (decltype(size) ii = 0; ii < size; ++ii) {
            auto nextChar = val.find_first_of(",;]", firstBracket + 1);
            auto cval = helicsGetComplex(val.substr(firstBracket + 1, nextChar - firstBracket - 1));
            data.push_back(cval);
            firstBracket = nextChar;
        }
    } else {
        if (val.find_first_of("ji") != std::string_view::npos) {
            auto cval = helicsGetComplex(val);
            data.resize(0);
            data.push_back(cval);
        } else {
            auto json = fileops::loadJsonStr(val);
            int cnt{0};
            switch (json.type()) {
                case nlohmann::json::value_t::number_float:
                case nlohmann::json::value_t::number_integer:
                case nlohmann::json::value_t::number_unsigned:
                    data.resize(0);
                    data.emplace_back(json.get<double>(), 0.0);
                    break;
                case nlohmann::json::value_t::array:
                    for (auto& aval : json) {
                        if (aval.is_number()) {
                            if (cnt == 0) {
                                data.emplace_back(aval.get<double>(), 0.0);
                                cnt = 1;
                            } else {
                                data.back() += std::complex<double>{0.0, aval.get<double>()};
                                cnt = 0;
                            }
                        } else if (aval.is_array()) {
                            cnt = 0;
                            if (aval.size() >= 2) {
                                if (aval[0].is_number()) {
                                    data.emplace_back(aval[0].get<double>(), aval[1].get<double>());
                                }
                            } else if (aval.size() == 1) {
                                if (aval[0].is_number()) {
                                    data.emplace_back(aval[0].get<double>(), 0.0);
                                }
                            } else {
                                data.push_back(invalidValue<std::complex<double>>());
                            }
                        }
                    }
                    break;
                default:
                    break;
            }
        }
    }
}